

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

int arbiter::remove(char *__filename)

{
  int iVar1;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)__filename);
  expandTilde(&local_30,&local_50);
  ::std::__cxx11::string::operator=((string *)__filename,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  iVar1 = ::remove(*(char **)__filename);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool remove(std::string filename)
{
    filename = expandTilde(filename);

    return ::remove(filename.c_str()) == 0;
}